

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoViableAltException.cpp
# Opt level: O2

string * __thiscall
NoViableAltException::getErrorMessage_abi_cxx11_
          (string *__return_storage_ptr__,NoViableAltException *this)

{
  Ref *pRVar1;
  Ref *pRVar2;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pRVar1 = (this->token).ref;
  if ((pRVar1 == (Ref *)0x0) || (pRVar1->ptr == (Token *)0x0)) {
    pRVar2 = (this->node).ref;
    if ((pRVar2 == (Ref *)0x0) || (pRVar2->ptr == (AST *)0x0)) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"unexpected end of subtree",(allocator *)&local_50
                );
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&local_50,"unexpected AST node: ",&local_51);
    AST::toString_abi_cxx11_(&local_30,((this->node).ref)->ptr);
    std::operator+(__return_storage_ptr__,&local_50,&local_30);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"unexpected token: ",&local_51);
    (*((this->token).ref)->ptr->_vptr_Token[2])(&local_30);
    std::operator+(__return_storage_ptr__,&local_50,&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string NoViableAltException::getErrorMessage() const
{
	if (token)
		return std::string("unexpected token: ")+token->getText();

	// must a tree parser error if token==null
	if (!node) {
		return "unexpected end of subtree";
	}
	return std::string("unexpected AST node: ")+node->toString();
}